

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

_Bool cfg_parse_simple_object(json_value *value,config_item *items)

{
  int iVar1;
  _Bool _Var2;
  char *pcVar3;
  config_item *item_00;
  json_object_entry *obj;
  config_item *item;
  int n;
  int i;
  config_item *items_local;
  json_value *value_local;
  
  if ((value == (json_value *)0x0) || (value->type != json_object)) {
    value_local._7_1_ = false;
  }
  else {
    iVar1 = (value->u).boolean;
    for (item._4_4_ = 0; item._4_4_ < iVar1; item._4_4_ = item._4_4_ + 1) {
      pcVar3 = (value->u).string.ptr + (long)item._4_4_ * 0x18;
      item_00 = cfg_find_item(*(char **)pcVar3,items);
      if (item_00 == (config_item *)0x0) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                   0x1a8,"cfg_parse_simple_object",0,3,"Unrecognized attribute: %s",
                   *(undefined8 *)pcVar3);
        return false;
      }
      _Var2 = save_object_value(*(json_value **)(pcVar3 + 0x10),item_00);
      if (!_Var2) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                   0x1a3,"cfg_parse_simple_object",0,3,"Failed to parse attributes in: %s",
                   item_00->key);
        return false;
      }
    }
    value_local._7_1_ = true;
  }
  return value_local._7_1_;
}

Assistant:

bool cfg_parse_simple_object(json_value * value, config_item * items)
{
    int i, n;
    config_item * item;
    json_object_entry * obj;
   
    // accept object only
    if (value == NULL || value->type != json_object)
        return false;

    n = value->u.object.length;
    for (i = 0; i < n; i ++) {
        obj = value->u.object.values + i;
        item = cfg_find_item(obj->name, items);
        if (item) {
            if (!save_object_value(obj->value, item)) {
                // Invalid value type
                log_error(LOG_ERR, "Failed to parse attributes in: %s", item->key);
                return false;
            }
        }
        else {
            log_error(LOG_ERR, "Unrecognized attribute: %s", obj->name);
            return false;
        }
    }
    return true;
}